

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

uint32_t bcread_uleb128(LexState *ls)

{
  byte bVar1;
  uint8_t *puVar2;
  int sh;
  uint32_t v;
  uint8_t *p;
  LexState *ls_local;
  
  p = (uint8_t *)(ls->p + 1);
  v = (uint32_t)(byte)*ls->p;
  if (0x7f < v) {
    sh = 0;
    v = v & 0x7f;
    do {
      sh = sh + 7;
      v = (*p & 0x7f) << ((byte)sh & 0x1f) | v;
      ls->n = ls->n - 1;
      puVar2 = p + 1;
      bVar1 = *p;
      p = puVar2;
    } while (0x7f < bVar1);
  }
  ls->n = ls->n - 1;
  ls->p = (char *)p;
  return v;
}

Assistant:

static uint32_t bcread_uleb128(LexState *ls)
{
  const uint8_t *p = (const uint8_t *)ls->p;
  uint32_t v = *p++;
  if (LJ_UNLIKELY(v >= 0x80)) {
    int sh = 0;
    v &= 0x7f;
    do {
     v |= ((*p & 0x7f) << (sh += 7));
     bcread_dec(ls);
   } while (*p++ >= 0x80);
  }
  bcread_dec(ls);
  ls->p = (char *)p;
  return v;
}